

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

char * ucnv_getAvailableName_63(int32_t n)

{
  UBool UVar1;
  char *pcVar2;
  char *name;
  UErrorCode err;
  int32_t n_local;
  
  if ((-1 < n) && (n < 0x10000)) {
    name._0_4_ = U_ZERO_ERROR;
    name._4_4_ = n;
    pcVar2 = ucnv_bld_getAvailableConverter_63((uint16_t)n,(UErrorCode *)&name);
    UVar1 = U_SUCCESS((UErrorCode)name);
    if (UVar1 != '\0') {
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char*   U_EXPORT2
ucnv_getAvailableName (int32_t n)
{
    if (0 <= n && n <= 0xffff) {
        UErrorCode err = U_ZERO_ERROR;
        const char *name = ucnv_bld_getAvailableConverter((uint16_t)n, &err);
        if (U_SUCCESS(err)) {
            return name;
        }
    }
    return NULL;
}